

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManDumpVerilog(Aig_Man_t *p,char *pFileName)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *p_00;
  FILE *__s;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  int i;
  ulong uVar9;
  
  if (p->nObjs[3] != 0) {
    pAVar5 = (Aig_Obj_t *)0x0;
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
      iVar1 = Aig_ObjIsConst1((Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
      if (iVar1 != 0) {
        pAVar5 = p->pConst1;
      }
    }
    iVar7 = 1;
    p_00 = Aig_ManDfs(p,1);
    (p->pConst1->field_5).iData = 0;
    iVar1 = 0;
    while( true ) {
      if (p->vCis->nSize <= iVar1) break;
      pvVar3 = Vec_PtrEntry(p->vCis,iVar1);
      *(int *)((long)pvVar3 + 0x28) = iVar7;
      iVar7 = iVar7 + 1;
      iVar1 = iVar1 + 1;
    }
    iVar1 = 0;
    while( true ) {
      if (p->vCos->nSize <= iVar1) break;
      pvVar3 = Vec_PtrEntry(p->vCos,iVar1);
      *(int *)((long)pvVar3 + 0x28) = iVar7 + iVar1;
      iVar1 = iVar1 + 1;
    }
    for (i = 0; uVar2 = iVar7 + iVar1 + i, i < p_00->nSize; i = i + 1) {
      pvVar3 = Vec_PtrEntry(p_00,i);
      *(uint *)((long)pvVar3 + 0x28) = uVar2;
    }
    uVar2 = Abc_Base10Log(uVar2);
    uVar9 = (ulong)uVar2;
    __s = fopen(pFileName,"w");
    fwrite("// Verilog file written by procedure Aig_ManDumpVerilog()\n",0x3a,1,__s);
    pcVar6 = "test";
    if (p->pName != (char *)0x0) {
      pcVar6 = p->pName;
    }
    pcVar8 = "module %s ( clock";
    if (p->nRegs == 0) {
      pcVar8 = "module %s (";
    }
    fprintf(__s,pcVar8,pcVar6);
    for (iVar7 = 0; iVar1 = p->nRegs, iVar7 < p->nObjs[2] - iVar1; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCis,iVar7);
      pcVar6 = ",";
      if (p->nRegs == 0 && iVar7 == 0) {
        pcVar6 = "";
      }
      fprintf(__s,"%s n%0*d",pcVar6,uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28));
    }
    for (iVar7 = 0; iVar7 < p->nObjs[3] - iVar1; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
      fprintf(__s,", n%0*d",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28));
      iVar1 = p->nRegs;
    }
    fwrite(" );\n",4,1,__s);
    if (p->nRegs != 0) {
      fwrite("input clock;\n",0xd,1,__s);
    }
    for (iVar7 = 0; iVar1 = p->nRegs, iVar7 < p->nObjs[2] - iVar1; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCis,iVar7);
      fprintf(__s,"input n%0*d;\n",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28));
    }
    for (iVar7 = 0; iVar7 < p->nObjs[3] - iVar1; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
      fprintf(__s,"output n%0*d;\n",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28));
      iVar1 = p->nRegs;
    }
    if (iVar1 != 0) {
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
        Aig_ManLi(p,iVar7);
        pAVar4 = Aig_ManLo(p,iVar7);
        fprintf(__s,"reg n%0*d;\n",uVar9,(ulong)(uint)(pAVar4->field_5).iData);
        iVar1 = p->nRegs;
      }
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar4 = Aig_ManLi(p,iVar7);
        Aig_ManLo(p,iVar7);
        fprintf(__s,"wire n%0*d;\n",uVar9,(ulong)(uint)(pAVar4->field_5).iData);
        iVar1 = p->nRegs;
      }
    }
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar7);
      fprintf(__s,"wire n%0*d;\n",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28));
    }
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      fprintf(__s,"wire n%0*d;\n",uVar9,(ulong)(uint)(pAVar5->field_5).iData);
      fprintf(__s,"assign n%0*d = 1\'b1;\n",uVar9,(ulong)(uint)(pAVar5->field_5).iData);
    }
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar7);
      pcVar6 = "\r\n\t ";
      if ((*(ulong *)((long)pvVar3 + 8) & 1) != 0) {
        pcVar6 = " & ~";
      }
      pcVar8 = "\r\n\t ";
      if ((*(ulong *)((long)pvVar3 + 0x10) & 1) != 0) {
        pcVar8 = " & ~";
      }
      fprintf(__s,"assign n%0*d = %sn%0*d & %sn%0*d;\n",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28),
              pcVar6 + 3,uVar9,
              (ulong)*(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28),
              pcVar8 + 3,uVar9,
              (ulong)*(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x28));
    }
    for (iVar7 = 0; iVar1 = p->nRegs, iVar7 < p->nObjs[3] - iVar1; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,iVar7);
      pcVar6 = "\r\n\t ";
      if ((*(ulong *)((long)pvVar3 + 8) & 1) != 0) {
        pcVar6 = " & ~";
      }
      fprintf(__s,"assign n%0*d = %sn%0*d;\n",uVar9,(ulong)*(uint *)((long)pvVar3 + 0x28),pcVar6 + 3
              ,uVar9,(ulong)*(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28));
    }
    if (iVar1 != 0) {
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar5 = Aig_ManLi(p,iVar7);
        Aig_ManLo(p,iVar7);
        pcVar6 = " & ~";
        if (((ulong)pAVar5->pFanin0 & 1) == 0) {
          pcVar6 = "\r\n\t ";
        }
        fprintf(__s,"assign n%0*d = %sn%0*d;\n",uVar9,(ulong)(uint)(pAVar5->field_5).iData,
                pcVar6 + 3,uVar9,
                (ulong)*(uint *)(((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe) + 0x28));
        iVar1 = p->nRegs;
      }
      if (iVar1 != 0) {
        for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
          pAVar5 = Aig_ManLi(p,iVar7);
          pAVar4 = Aig_ManLo(p,iVar7);
          fprintf(__s,"always @ (posedge clock) begin n%0*d <= n%0*d; end\n",uVar9,
                  (ulong)(uint)(pAVar4->field_5).iData,uVar9,(ulong)(uint)(pAVar5->field_5).iData);
          iVar1 = p->nRegs;
        }
        for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
          Aig_ManLi(p,iVar7);
          pAVar5 = Aig_ManLo(p,iVar7);
          fprintf(__s,"initial begin n%0*d <= 1\'b0; end\n",uVar9,
                  (ulong)(uint)(pAVar5->field_5).iData);
          iVar1 = p->nRegs;
        }
      }
    }
    fwrite("endmodule\n\n",0xb,1,__s);
    fclose(__s);
    Vec_PtrFree(p_00);
    return;
  }
  puts("Aig_ManDumpBlif(): AIG manager does not have POs.");
  return;
}

Assistant:

void Aig_ManDumpVerilog( Aig_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pConst1 = NULL;
    int i, nDigits, Counter = 0;
    if ( Aig_ManCoNum(p) == 0 )
    {
        printf( "Aig_ManDumpBlif(): AIG manager does not have POs.\n" );
        return;
    }
    // check if constant is used
    Aig_ManForEachCo( p, pObj, i )
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            pConst1 = Aig_ManConst1(p);
    // collect nodes in the DFS order
    vNodes = Aig_ManDfs( p, 1 );
    // assign IDs to objects
    Aig_ManConst1(p)->iData = Counter++;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Counter++;
    Aig_ManForEachCo( p, pObj, i )
        pObj->iData = Counter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->iData = Counter++;
    nDigits = Abc_Base10Log( Counter );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "// Verilog file written by procedure Aig_ManDumpVerilog()\n" );
//    fprintf( pFile, "// http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "module %s ( clock", p->pName? p->pName: "test" );
    else
        fprintf( pFile, "module %s (", p->pName? p->pName: "test" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "%s n%0*d", ((Aig_ManRegNum(p) || i)? ",":""), nDigits, pObj->iData );
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, ", n%0*d", nDigits, pObj->iData );
    fprintf( pFile, " );\n" );

    // write PIs
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "input clock;\n" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "input n%0*d;\n", nDigits, pObj->iData );
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, "output n%0*d;\n", nDigits, pObj->iData );
    // write latches
    if ( Aig_ManRegNum(p) )
    {
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "reg n%0*d;\n", nDigits, pObjLo->iData );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObjLi->iData );
    }
    // write nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObj->iData );
    if ( pConst1 )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pConst1->iData );
    // write nodes
    if ( pConst1 )
        fprintf( pFile, "assign n%0*d = 1\'b1;\n", nDigits, pConst1->iData );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d & %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData, 
            !Aig_ObjFaninC1(pObj) ? " " : "~", nDigits, Aig_ObjFanin1(pObj)->iData
            );
    }
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData );
    }
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
                nDigits, pObjLi->iData,
                !Aig_ObjFaninC0(pObjLi) ? " " : "~", nDigits, Aig_ObjFanin0(pObjLi)->iData );
        }
    }

    // write initial state
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "always @ (posedge clock) begin n%0*d <= n%0*d; end\n", 
                 nDigits, pObjLo->iData,
                 nDigits, pObjLi->iData );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "initial begin n%0*d <= 1\'b0; end\n", 
                 nDigits, pObjLo->iData );
    }

    fprintf( pFile, "endmodule\n\n" );
    fclose( pFile );
    Vec_PtrFree( vNodes );
}